

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::
~BayesianProbitRegressor_FeatureValueWeight(BayesianProbitRegressor_FeatureValueWeight *this)

{
  ~BayesianProbitRegressor_FeatureValueWeight(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

BayesianProbitRegressor_FeatureValueWeight::~BayesianProbitRegressor_FeatureValueWeight() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}